

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O2

void __thiscall soplex::NameSet::memPack(NameSet *this)

{
  DataKey *pDVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  char *newmem;
  char *local_48;
  DataKey local_40;
  Name local_38;
  
  local_48 = (char *)0x0;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::clear(&this->hashtab);
  spx_alloc<char*>(&local_48,this->memused);
  lVar4 = 0;
  iVar2 = 0;
  while( true ) {
    if ((this->set).thenum <= lVar4) break;
    __s = this->mem + (this->set).theitem[(this->set).thekey[lVar4].idx].data;
    spxSnprintf(local_48 + iVar2,0x400,"%s",__s);
    (this->set).theitem[(this->set).thekey[lVar4].idx].data = iVar2;
    sVar3 = strlen(__s);
    iVar2 = (int)sVar3 + iVar2 + 1;
    lVar4 = lVar4 + 1;
  }
  memcpy(this->mem,local_48,(long)iVar2);
  this->memused = iVar2;
  free(local_48);
  local_48 = (char *)0x0;
  for (lVar4 = 0; lVar4 < (this->set).thenum; lVar4 = lVar4 + 1) {
    pDVar1 = (this->set).thekey;
    local_38.name = this->mem + (this->set).theitem[pDVar1[lVar4].idx].data;
    local_40 = pDVar1[lVar4];
    DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add(&this->hashtab,&local_38,&local_40);
  }
  return;
}

Assistant:

void NameSet::memPack()
{
   char* newmem = nullptr;
   int   newlast = 0;
   int   i;

   hashtab.clear();

   spx_alloc(newmem, memSize());

   for(i = 0; i < num(); i++)
   {
      const char* t = &mem[set[i]];
      spxSnprintf(&newmem[newlast], SPX_MAXSTRLEN, "%s", t);
      set[i] = newlast;
      newlast += int(strlen(t)) + 1;
   }

   memcpy(mem, newmem, static_cast<size_t>(newlast));
   memused = newlast;

   assert(memSize() <= memMax());

   spx_free(newmem);

   for(i = 0; i < num(); i++)
      hashtab.add(Name(&mem[set[key(i)]]), key(i));
}